

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

Result wabt::ParseUint64(char *s,char *end,uint64_t *out)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  
  if (s == end) {
    return (Result)Error;
  }
  pcVar2 = end;
  if (((*s == '0') && (s + 1 < end)) && (s[1] == 'x')) {
    s = s + 2;
    if (s == end) {
      return (Result)Error;
    }
    if (s < end) {
      uVar1 = 0;
      do {
        iVar3 = (int)*s;
        if (iVar3 != 0x5f) {
          uVar4 = iVar3 - 0x30;
          if (9 < uVar4) {
            if (iVar3 - 0x61U < 6) {
              uVar4 = iVar3 - 0x57;
            }
            else {
              if (5 < iVar3 - 0x41U) {
                return (Result)Error;
              }
              uVar4 = iVar3 - 0x37;
            }
          }
          if (uVar1 >> 0x3c != 0) {
            return (Result)Error;
          }
          uVar1 = uVar1 * 0x10 + (ulong)uVar4;
        }
        s = s + 1;
      } while (s != end);
      goto LAB_00156939;
    }
  }
  else if (s < end) {
    uVar1 = 0;
    do {
      if (*s != 0x5f) {
        uVar4 = (int)*s - 0x30;
        if (9 < uVar4) {
          return (Result)Error;
        }
        if (0x1999999999999999 < uVar1) {
          return (Result)Error;
        }
        if (uVar1 == 0x1999999999999999 && 5 < uVar4) {
          return (Result)Error;
        }
        uVar1 = (ulong)uVar4 + uVar1 * 10;
      }
      s = s + 1;
    } while (s != end);
    goto LAB_00156939;
  }
  uVar1 = 0;
  pcVar2 = s;
LAB_00156939:
  if (pcVar2 != end) {
    return (Result)Error;
  }
  *out = uVar1;
  return (Result)Ok;
}

Assistant:

Result ParseUint64(const char* s, const char* end, uint64_t* out) {
  if (s == end) {
    return Result::Error;
  }
  uint64_t value = 0;
  if (*s == '0' && s + 1 < end && s[1] == 'x') {
    s += 2;
    if (s == end) {
      return Result::Error;
    }
    constexpr uint64_t kMaxDiv16 = UINT64_MAX / 16;
    constexpr uint64_t kMaxMod16 = UINT64_MAX % 16;
    for (; s < end; ++s) {
      uint32_t digit;
      if (*s == '_') {
        continue;
      }
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      // Check for overflow.
      if (value > kMaxDiv16 || (value == kMaxDiv16 && digit > kMaxMod16)) {
        return Result::Error;
      }
      value = value * 16 + digit;
    }
  } else {
    constexpr uint64_t kMaxDiv10 = UINT64_MAX / 10;
    constexpr uint64_t kMaxMod10 = UINT64_MAX % 10;
    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit = (*s - '0');
      if (digit > 9) {
        return Result::Error;
      }
      // Check for overflow.
      if (value > kMaxDiv10 || (value == kMaxDiv10 && digit > kMaxMod10)) {
        return Result::Error;
      }
      value = value * 10 + digit;
    }
  }
  if (s != end) {
    return Result::Error;
  }
  *out = value;
  return Result::Ok;
}